

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O3

void __thiscall
Compiler::processVariable
          (Compiler *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *line)

{
  InstructionGenerator *pIVar1;
  pointer pSVar2;
  pointer pcVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined8 __nptr;
  char cVar6;
  DataType type;
  int iVar7;
  DataType DVar8;
  uint uVar9;
  long *plVar10;
  ulong uVar11;
  undefined8 *puVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar13;
  Variable *pVVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  size_type *psVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *arraySize_out;
  uint __val;
  ulong uVar16;
  _Alloc_hider _Var17;
  pointer pbVar18;
  pointer pbVar19;
  Parser *this_00;
  ulong uVar20;
  undefined1 auVar21 [16];
  string args;
  string arrayName;
  string arraySize;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  undefined1 local_230 [8];
  _Alloc_hider local_228;
  undefined1 local_220 [24];
  bool local_208;
  uint local_204;
  string local_200;
  Parser *local_1e0;
  uint local_1d4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  type = stringToDataType((line->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start);
  if ((type == UNKNOWN) &&
     (iVar7 = std::__cxx11::string::compare
                        ((char *)(line->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start), iVar7 != 0)) {
    iVar7 = std::__cxx11::string::compare
                      ((char *)((line->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1));
    if (iVar7 == 0) {
      Parser::combineArguments
                (&local_200,&this->parser,line,2,
                 (int)((ulong)((long)(line->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(line->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start) >> 5) - 2);
      puVar12 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_200,0,(char *)0x0,0x110367);
      psVar15 = puVar12 + 2;
      if ((size_type *)*puVar12 == psVar15) {
        local_220._0_8_ = *psVar15;
        local_220._8_8_ = puVar12[3];
        local_230 = (undefined1  [8])local_220;
      }
      else {
        local_220._0_8_ = *psVar15;
        local_230 = (undefined1  [8])*puVar12;
      }
      local_228._M_p = (pointer)puVar12[1];
      *puVar12 = psVar15;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(local_230);
      psVar15 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_130.field_2._M_allocated_capacity = *psVar15;
        local_130.field_2._8_8_ = plVar10[3];
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      }
      else {
        local_130.field_2._M_allocated_capacity = *psVar15;
        local_130._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_130._M_string_length = plVar10[1];
      *plVar10 = (long)psVar15;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      evaluateBracket(this,&local_130);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p);
      }
      if (local_230 != (undefined1  [8])local_220) {
        operator_delete((void *)local_230);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p);
      }
    }
    else {
      pIVar1 = &this->igen;
      InstructionGenerator::genCloneTop
                (pIVar1,(line->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start);
      Parser::combineArguments
                (&local_200,&this->parser,line,2,
                 (int)((ulong)((long)(line->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(line->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start) >> 5) - 2);
      plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_200,0,(char *)0x0,0x110367);
      psVar15 = (size_type *)(plVar10 + 2);
      if ((size_type *)*plVar10 == psVar15) {
        local_220._0_8_ = *psVar15;
        local_220._8_8_ = plVar10[3];
        local_230 = (undefined1  [8])local_220;
      }
      else {
        local_220._0_8_ = *psVar15;
        local_230 = (undefined1  [8])*plVar10;
      }
      local_228._M_p = (pointer)plVar10[1];
      *plVar10 = (long)psVar15;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(local_230);
      psVar15 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_150.field_2._M_allocated_capacity = *psVar15;
        local_150.field_2._8_8_ = plVar10[3];
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      }
      else {
        local_150.field_2._M_allocated_capacity = *psVar15;
        local_150._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_150._M_string_length = plVar10[1];
      *plVar10 = (long)psVar15;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      evaluateBracket(this,&local_150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p);
      }
      if (local_230 != (undefined1  [8])local_220) {
        operator_delete((void *)local_230);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p);
      }
      iVar7 = std::__cxx11::string::compare
                        ((char *)((line->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 1));
      if (iVar7 == 0) {
        InstructionGenerator::genMathMultiply(pIVar1,2);
      }
      else {
        iVar7 = std::__cxx11::string::compare
                          ((char *)((line->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + 1));
        if (iVar7 == 0) {
          InstructionGenerator::genMathDivide(pIVar1,2);
        }
        else {
          iVar7 = std::__cxx11::string::compare
                            ((char *)((line->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + 1));
          if (iVar7 == 0) {
            InstructionGenerator::genMathModulus(pIVar1,2);
          }
          else {
            iVar7 = std::__cxx11::string::compare
                              ((char *)((line->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + 1));
            if (iVar7 == 0) {
              InstructionGenerator::genMathAdd(pIVar1,2);
            }
            else {
              iVar7 = std::__cxx11::string::compare
                                ((char *)((line->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + 1));
              if (iVar7 == 0) {
                InstructionGenerator::genMathSubtract(pIVar1,2);
              }
              else {
                iVar7 = std::__cxx11::string::compare
                                  ((char *)((line->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + 1));
                if (iVar7 == 0) {
                  InstructionGenerator::genConcentrateStrings(pIVar1,2);
                }
              }
            }
          }
        }
      }
    }
    InstructionGenerator::genSetVariable
              (&this->igen,
               (line->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start);
    return;
  }
  DVar8 = stringToDataType((line->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start);
  pSVar2 = (this->openScopeStack).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (((this->openScopeStack).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
       super__Vector_impl_data._M_start != pSVar2) && (pSVar2[-1].type == CLASS)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nVar in class: ",0xf)
    ;
    pbVar18 = (line->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,pbVar18[1]._M_dataplus._M_p,pbVar18[1]._M_string_length);
    pSVar2 = (this->pastScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pbVar18 = (line->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_230._0_4_ = DVar8;
    pcVar3 = pbVar18[1]._M_dataplus._M_p;
    local_228._M_p = local_220 + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_228,pcVar3,pcVar3 + pbVar18[1]._M_string_length);
    local_208 = false;
    local_204 = 0;
    std::vector<Variable,_std::allocator<Variable>_>::emplace_back<Variable>
              (&pSVar2[-1].childDataMembers,(Variable *)local_230);
    _Var17._M_p = local_228._M_p;
    if (local_228._M_p == local_220 + 8) {
      return;
    }
    goto LAB_00104f09;
  }
  pbVar18 = (line->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar19 = (line->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  this_00 = &this->parser;
  cVar6 = Parser::isArrayDefinition(this_00,pbVar18 + 1);
  if ((ulong)((long)pbVar19 - (long)pbVar18) < 0x41) {
LAB_00104e50:
    if (cVar6 == '\0') {
      InstructionGenerator::genCreateDefaultValue
                (&this->igen,
                 (line->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 1,type);
      return;
    }
    local_230 = (undefined1  [8])local_220;
    local_228._M_p = (pointer)0x0;
    local_220._0_8_ = local_220._0_8_ & 0xffffffffffffff00;
    local_200._M_string_length = 0;
    local_200.field_2._M_local_buf[0] = '\0';
    pbVar18 = (line->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pcVar3 = pbVar18[1]._M_dataplus._M_p;
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,pcVar3,pcVar3 + pbVar18[1]._M_string_length);
    Parser::splitArrayDefinition(this_00,&local_110,(string *)local_230,&local_200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    InstructionGenerator::genCreateArray(&this->igen,(string *)local_230,&local_200,type);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p);
    }
    _Var17._M_p = (pointer)local_230;
    if (local_230 == (undefined1  [8])local_220) {
      return;
    }
LAB_00104f09:
    operator_delete(_Var17._M_p);
    return;
  }
  if (!(bool)cVar6) {
    pIVar1 = &this->igen;
    VirtualStack::getStackSize(&pIVar1->super_VirtualStack);
    Parser::combineArguments
              (&local_90,this_00,line,3,
               (int)((ulong)((long)(line->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(line->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start) >> 5) - 3);
    evaluateBracket(this,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    VirtualStack::getStackSize(&pIVar1->super_VirtualStack);
    uVar9 = VirtualStack::getStackSize(&pIVar1->super_VirtualStack);
    VirtualStack::renameVariable
              (&pIVar1->super_VirtualStack,uVar9 - 1,
               (line->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 1);
    return;
  }
  Parser::combineArguments
            (&local_50,this_00,line,3,
             (int)((ulong)((long)(line->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(line->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 5) - 3);
  Parser::extractBracketArguments(&local_248,this_00,&local_50);
  local_1e0 = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pbVar19 = local_248.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish + -1;
  pbVar18 = local_248.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_248.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start < pbVar19 &&
      local_248.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_248.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::__cxx11::string::swap((string *)pbVar18);
      pbVar18 = pbVar18 + 1;
      pbVar19 = pbVar19 + -1;
    } while (pbVar18 < pbVar19);
  }
  local_230 = (undefined1  [8])local_220;
  local_228._M_p = (pointer)0x0;
  local_220._0_8_ = local_220._0_8_ & 0xffffffffffffff00;
  if (local_248.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_248.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar16 = 0;
    uVar20 = 1;
    do {
      std::__cxx11::string::_M_append
                (local_230,
                 (ulong)local_248.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar16]._M_dataplus._M_p);
      uVar11 = (long)local_248.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_248.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      if (uVar11 - 1 != uVar16) {
        std::__cxx11::string::append(local_230);
        uVar11 = (long)local_248.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_248.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
      }
      bVar4 = uVar20 < uVar11;
      uVar16 = uVar20;
      uVar20 = (ulong)((int)uVar20 + 1);
    } while (bVar4);
  }
  pIVar1 = &this->igen;
  uVar9 = VirtualStack::getStackSize(&pIVar1->super_VirtualStack);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,local_230,local_228._M_p + (long)local_230);
  evaluateBracket(this,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  local_1d4 = uVar9;
  uVar9 = VirtualStack::getStackSize(&pIVar1->super_VirtualStack);
  this_00 = (Parser *)(ulong)uVar9;
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  local_200._M_string_length = 0;
  local_200.field_2._M_local_buf[0] = '\0';
  local_1b0._M_allocated_capacity = (size_type)&local_1a0;
  local_1b0._8_8_ = 0;
  local_1a0._M_local_buf[0] = '\0';
  pbVar18 = (line->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pcVar3 = pbVar18[1]._M_dataplus._M_p;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar3,pcVar3 + pbVar18[1]._M_string_length);
  arraySize_out = &local_1b0;
  Parser::splitArrayDefinition(local_1e0,&local_d0,&local_200,(string *)arraySize_out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  __nptr = local_1b0._M_allocated_capacity;
  if (local_1b0._8_8_ == 0) {
    pvVar13 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)local_248.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_248.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5);
    line = pvVar13;
LAB_001052bb:
    __val = (uint)line;
    if (pvVar13 <=
        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)((ulong)line & 0xffffffff)) {
      uVar9 = uVar9 - local_1d4;
      if (uVar9 == __val) {
        uVar9 = VirtualStack::getStackSize(&pIVar1->super_VirtualStack);
        VirtualStack::renameVariable(&pIVar1->super_VirtualStack,uVar9 - __val,&local_200);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f0,local_200._M_dataplus._M_p,
                   local_200._M_dataplus._M_p + local_200._M_string_length);
        uVar9 = VirtualStack::isVariable(&pIVar1->super_VirtualStack,&local_f0);
        pVVar14 = VirtualStack::getVariable(&pIVar1->super_VirtualStack,uVar9);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        pVVar14->arrayLength = __val;
        pVVar14->isArray = true;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_allocated_capacity != &local_1a0) {
          operator_delete((void *)local_1b0._M_allocated_capacity);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p);
        }
        if (local_230 != (undefined1  [8])local_220) {
          operator_delete((void *)local_230);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_248);
        return;
      }
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      std::__cxx11::to_string(&local_190,uVar9);
      std::operator+(&local_170,"Invalid array initialiser arguments. Got ",&local_190);
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_170);
      local_1d0._M_dataplus._M_p = (pointer)*plVar10;
      psVar15 = (size_type *)(plVar10 + 2);
      if ((size_type *)local_1d0._M_dataplus._M_p == psVar15) {
        local_1d0.field_2._M_allocated_capacity = *psVar15;
        local_1d0.field_2._8_8_ = plVar10[3];
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      }
      else {
        local_1d0.field_2._M_allocated_capacity = *psVar15;
      }
      local_1d0._M_string_length = plVar10[1];
      *plVar10 = (long)psVar15;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      std::operator+(__return_storage_ptr__,&local_1d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b0
                    );
      __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
    this = (Compiler *)__cxa_allocate_exception(0x20);
    std::__cxx11::to_string(&local_190,__val);
    std::operator+(&local_170,
                   "Array initialiser contains too many elements for the array to hold. Array size: "
                   ,&local_190);
    puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_170);
    auVar5._8_8_ = &local_1d0.field_2;
    auVar5._0_8_ = puVar12;
    auVar21._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*puVar12;
    auVar21._0_8_ = puVar12;
    arraySize_out =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(puVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar12 == arraySize_out) {
      local_1d0.field_2._M_allocated_capacity = arraySize_out->_M_allocated_capacity;
      local_1d0.field_2._8_8_ = puVar12[3];
      auVar21 = auVar5;
      goto LAB_001054e9;
    }
  }
  else {
    this = (Compiler *)__errno_location();
    local_1e0 = (Parser *)CONCAT44(local_1e0._4_4_,*(int *)&this->_vptr_Compiler);
    *(int *)&this->_vptr_Compiler = 0;
    line = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)strtoull((char *)__nptr,(char **)&local_1d0,10);
    if (local_1d0._M_dataplus._M_p != (pointer)__nptr) {
      if (*(int *)&this->_vptr_Compiler == 0) {
        *(int *)&this->_vptr_Compiler = (int)local_1e0;
      }
      else {
        type = (int)&local_200 + 0x10;
        if (*(int *)&this->_vptr_Compiler == 0x22) {
          cVar6 = std::__throw_out_of_range("stoull");
          goto LAB_00104e50;
        }
      }
      pvVar13 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)local_248.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_248.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5);
      goto LAB_001052bb;
    }
    auVar21 = std::__throw_invalid_argument("stoull");
  }
  local_1d0.field_2._M_allocated_capacity = arraySize_out->_M_allocated_capacity;
LAB_001054e9:
  local_1d0._M_dataplus._M_p = auVar21._8_8_;
  puVar12 = auVar21._0_8_;
  local_1d0._M_string_length = puVar12[1];
  *puVar12 = arraySize_out;
  puVar12[1] = 0;
  *(undefined1 *)(puVar12 + 2) = 0;
  std::__cxx11::to_string
            (&local_70,
             (long)local_248.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_248.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 &local_1d0,&local_70);
  __cxa_throw(this,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void Compiler::processVariable(const std::vector<std::string>& line) //things like "int a = 20"
{
    DataType possibleType = stringToDataType(line[0]);
    if(possibleType == DataType::UNKNOWN && line[0] != "auto") //If we're not creating a new variable (eg a = 20)
    {
        if(line[1] == "=") //If it's a set operation
        {
            //Evaluate the bracket containing what the variable should be set to
            evaluateBracket("(" + parser.combineArguments(line, 2, line.size() - 2) + ")");
        }
        else //Else if it's a math operation
        {
            //First move the variable data that we're operating on to the top of the stack
            igen.genCloneTop(line[0]);

            //Evaluate the bracket containing what the variable should be set to
            evaluateBracket("(" + parser.combineArguments(line, 2, line.size() - 2) + ")");

            //Do different things depending on the assignment operator
            if(line[1] == "*=")
            {
                igen.genMathMultiply(2);
            }
            else if(line[1] == "/=")
            {
                igen.genMathDivide(2);
            }
            else if(line[1] == "%=")
            {
                //Divide the last two things on the stack (the bracket and the variable)
                igen.genMathModulus(2);
            }
            else if(line[1] == "+=")
            {
                igen.genMathAdd(2);
            }
            else if(line[1] == "-=")
            {
                igen.genMathSubtract(2);
            }
            else if(line[1] == "@=")
            {
                igen.genConcentrateStrings(2);
            }
        }

        //Set the variable to the last thing on the stack
        igen.genSetVariable(line[0]);
    }
    else //If we're creating a new variable (eg int a = 20)
    {
        //Convert its data type from string to enum
        DataType type = stringToDataType(line[0]);

        if(!openScopeStack.empty() && openScopeStack.back().type == Scope::CLASS) //We're defining class members, so don't actually create them. Just register to the class.
        {
            std::cout << "\nVar in class: " << line[1];
            //NOTE TO SELF: ADD BRACKET INITIALISATION EVALUATION
            pastScopes.back().childDataMembers.emplace_back(Variable(line[1], type));
        }
        else //If we're not in a class, create the variables immediately
        {
            if(line.size() > 2) //If there's a value provided (int a = 20)
            {
                if(parser.isArrayDefinition(line[1])) //Check if it's an array definition
                {
                    //Flip argument list for left->right parsing
                    std::vector<std::string> &&arguments = parser.extractBracketArguments(parser.combineArguments(line, 3, line.size() - 3));
                    std::reverse(arguments.begin(), arguments.end());
                    std::string args;
                    for(unsigned int a = 0; a < arguments.size(); a++)
                    {
                        args += arguments[a];
                        if(a != arguments.size()-1)
                            args += ", ";
                    }

                    //Evaluate value to set it to and name the variable
                    unsigned int stackSizePrior = igen.getStackSize();

                    evaluateBracket(args);
                    unsigned int stackSizeAfter = igen.getStackSize();

                    //Split array definition into name and size
                    std::string arrayName;
                    std::string arraySize;
                    parser.splitArrayDefinition(line[1], arrayName, arraySize);

                    //Find how large to make it. Pick the size specified in the brackets if it's there, otherwise the number of elements in the initialiser list
                    unsigned int arraySizeCasted = 0;
                    if(!arraySize.empty())
                        arraySizeCasted = std::stoull(arraySize);
                    else
                        arraySizeCasted = (unsigned int)arguments.size();

                    //Check that the number of arguments in the initialiser list is smaller than the array size
                    if(arraySizeCasted < arguments.size())
                    {
                        throw std::string("Array initialiser contains too many elements for the array to hold. Array size: " + std::to_string(arraySizeCasted) + ". List size: " + std::to_string(arguments.size()));
                    }

                    if(arraySizeCasted != stackSizeAfter - stackSizePrior)
                    {
                        throw std::string("Invalid array initialiser arguments. Got " + std::to_string(stackSizeAfter - stackSizePrior) + ", expected " + arraySize);
                    }

                    //Name the created variables compiler side
                    igen.renameVariable(igen.getStackSize() - arraySizeCasted, arrayName);
                    Variable &var = igen.getVariable(igen.isVariable(arrayName));
                    var.arrayLength = arraySizeCasted;
                    var.isArray = true;
                }
                else
                {
                    //Evaluate value to set it to and name the variable
                    unsigned int stackSizePrior = igen.getStackSize();
                    evaluateBracket(parser.combineArguments(line, 3, line.size() - 3));
                    unsigned int stackSizeAfter = igen.getStackSize();

                    //Rename variable compiler side
                    igen.renameVariable(igen.getStackSize()-1, line[1]);
                }
            }
            else //Else no default value provided (int a)
            {
                if(parser.isArrayDefinition(line[1])) //Check if it's an array definition
                {
                    //Split array definition into name and size
                    std::string arrayName;
                    std::string arraySize;
                    parser.splitArrayDefinition(line[1], arrayName, arraySize);

                    //Create the array
                    igen.genCreateArray(arrayName, arraySize, possibleType);
                }
                else
                {
                    igen.genCreateDefaultValue(line[1], possibleType);
                }
            }
        }
    }
    return;
}